

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbbiscan.cpp
# Opt level: O0

UChar32 __thiscall icu_63::RBBIRuleScanner::nextCharLL(RBBIRuleScanner *this)

{
  int iVar1;
  int32_t iVar2;
  UChar32 ch;
  RBBIRuleScanner *this_local;
  
  iVar1 = this->fNextIndex;
  iVar2 = UnicodeString::length(this->fRB->fRules);
  if (iVar1 < iVar2) {
    this_local._4_4_ = UnicodeString::char32At(this->fRB->fRules,this->fNextIndex);
    iVar2 = UnicodeString::moveIndex32(this->fRB->fRules,this->fNextIndex,1);
    this->fNextIndex = iVar2;
    if ((((this_local._4_4_ == 0xd) || (this_local._4_4_ == 0x85)) || (this_local._4_4_ == 0x2028))
       || ((this_local._4_4_ == 10 && (this->fLastChar != 0xd)))) {
      this->fLineNum = this->fLineNum + 1;
      this->fCharNum = 0;
      if (this->fQuoteMode != '\0') {
        error(this,U_BRK_NEW_LINE_IN_QUOTED_STRING);
        this->fQuoteMode = '\0';
      }
    }
    else if (this_local._4_4_ != 10) {
      this->fCharNum = this->fCharNum + 1;
    }
    this->fLastChar = this_local._4_4_;
  }
  else {
    this_local._4_4_ = -1;
  }
  return this_local._4_4_;
}

Assistant:

UChar32  RBBIRuleScanner::nextCharLL() {
    UChar32  ch;

    if (fNextIndex >= fRB->fRules.length()) {
        return (UChar32)-1;
    }
    ch         = fRB->fRules.char32At(fNextIndex);
    fNextIndex = fRB->fRules.moveIndex32(fNextIndex, 1);

    if (ch == chCR ||
        ch == chNEL ||
        ch == chLS   ||
        (ch == chLF && fLastChar != chCR)) {
        // Character is starting a new line.  Bump up the line number, and
        //  reset the column to 0.
        fLineNum++;
        fCharNum=0;
        if (fQuoteMode) {
            error(U_BRK_NEW_LINE_IN_QUOTED_STRING);
            fQuoteMode = FALSE;
        }
    }
    else {
        // Character is not starting a new line.  Except in the case of a
        //   LF following a CR, increment the column position.
        if (ch != chLF) {
            fCharNum++;
        }
    }
    fLastChar = ch;
    return ch;
}